

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

drwav_uint64 drwav_read_s32__ima(drwav *pWav,drwav_uint64 samplesToRead,drwav_int32 *pBufferOut)

{
  drwav_uint64 dVar1;
  drwav_uint64 dVar2;
  drwav_int16 samples16 [2048];
  drwav_int16 adStack_1038 [2052];
  
  dVar2 = 0;
  while( true ) {
    if (samplesToRead == 0) {
      return dVar2;
    }
    dVar1 = 0x800;
    if (samplesToRead < 0x800) {
      dVar1 = samplesToRead;
    }
    dVar1 = drwav_read_s16(pWav,dVar1,adStack_1038);
    if (dVar1 == 0) break;
    drwav_s16_to_s32(pBufferOut,adStack_1038,dVar1);
    pBufferOut = pBufferOut + dVar1;
    samplesToRead = samplesToRead - dVar1;
    dVar2 = dVar2 + dVar1;
  }
  return dVar2;
}

Assistant:

drwav_uint64 drwav_read_s32__ima(drwav* pWav, drwav_uint64 samplesToRead, drwav_int32* pBufferOut) {
    // We're just going to borrow the implementation from the drwav_read_s16() since IMA-ADPCM is a little bit more
    // complicated than other formats and I don't want to duplicate that code.
    drwav_uint64 totalSamplesRead = 0;
    drwav_int16 samples16[2048];
    while (samplesToRead > 0) {
        drwav_uint64 samplesRead = drwav_read_s16(pWav, drwav_min(samplesToRead, 2048), samples16);
        if (samplesRead == 0) {
            break;
        }

        drwav_s16_to_s32(pBufferOut, samples16, (size_t)samplesRead);  // <-- Safe cast because we're clamping to 2048.

        pBufferOut += samplesRead;
        samplesToRead -= samplesRead;
        totalSamplesRead += samplesRead;
    }

    return totalSamplesRead;
}